

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cborencoder.c
# Opt level: O0

CborError encode_number_no_update(CborEncoder *encoder,uint64_t ui,uint8_t shiftedMajorType)

{
  CborError CVar1;
  sbyte local_49;
  char *pcStack_48;
  uint8_t more;
  uint8_t *bufstart;
  uint8_t *bufend;
  uint64_t buf [2];
  uint8_t shiftedMajorType_local;
  uint64_t ui_local;
  CborEncoder *encoder_local;
  
  pcStack_48 = (char *)((long)buf + 7);
  put64(buf,ui);
  if (ui < 0x18) {
    buf[0]._7_1_ = buf[0]._7_1_ + shiftedMajorType;
  }
  else {
    local_49 = 0xff < ui;
    if (0xffff < ui) {
      local_49 = local_49 + 1;
    }
    if (0xffffffff < ui) {
      local_49 = local_49 + 1;
    }
    pcStack_48 = pcStack_48 + -(1L << local_49);
    *pcStack_48 = shiftedMajorType + '\x18' + local_49;
  }
  CVar1 = append_to_buffer(encoder,pcStack_48,(long)buf + (8 - (long)pcStack_48));
  return CVar1;
}

Assistant:

static inline CborError encode_number_no_update(CborEncoder *encoder, uint64_t ui, uint8_t shiftedMajorType)
{
    /* Little-endian would have been so much more convenient here:
     * We could just write at the beginning of buf but append_to_buffer
     * only the necessary bytes.
     * Since it has to be big endian, do it the other way around:
     * write from the end. */
    uint64_t buf[2];
    uint8_t *const bufend = (uint8_t *)buf + sizeof(buf);
    uint8_t *bufstart = bufend - 1;
    put64(buf + 1, ui);     /* we probably have a bunch of zeros in the beginning */

    if (ui < Value8Bit) {
        *bufstart += shiftedMajorType;
    } else {
        uint8_t more = 0;
        if (ui > 0xffU)
            ++more;
        if (ui > 0xffffU)
            ++more;
        if (ui > 0xffffffffU)
            ++more;
        bufstart -= (size_t)1 << more;
        *bufstart = shiftedMajorType + Value8Bit + more;
    }

    return append_to_buffer(encoder, bufstart, bufend - bufstart);
}